

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

int rsa1_load_s_internal
              (BinarySource *src,RSAKey *key,_Bool pub_only,char **commentptr,char *passphrase,
              char **error)

{
  _Bool _Var1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  unsigned_long uVar6;
  char *pcVar7;
  ulong wanted;
  mp_int *pmVar8;
  ptrlen pVar9;
  int b1b;
  int b0b;
  int b1a;
  int b0a;
  undefined1 local_98 [8];
  uchar keybuf [16];
  size_t enclen;
  ptrlen comment;
  int ret;
  int ciphertype;
  strbuf *buf;
  char **error_local;
  char *passphrase_local;
  char **commentptr_local;
  _Bool pub_only_local;
  RSAKey *key_local;
  BinarySource *src_local;
  
  _ret = (strbuf *)0x0;
  comment.len._0_4_ = 0;
  *error = "not an SSH-1 RSA file";
  pVar9.len = 0x21;
  pVar9.ptr = "SSH PRIVATE KEY FILE FORMAT 1.1\n";
  _Var1 = expect_signature(src,pVar9);
  if (_Var1) {
    *error = "file format error";
    uVar2 = BinarySource_get_byte(src->binarysource_);
    if (((uVar2 == '\0') || (uVar2 == '\x03')) &&
       (uVar6 = BinarySource_get_uint32(src->binarysource_), uVar6 == 0)) {
      BinarySource_get_rsa_ssh1_pub(src->binarysource_,key,RSA_SSH1_MODULUS_FIRST);
      pVar9 = BinarySource_get_string(src->binarysource_);
      if (commentptr != (char **)0x0) {
        pcVar7 = mkstr(pVar9);
        *commentptr = pcVar7;
      }
      if (key != (RSAKey *)0x0) {
        pcVar7 = mkstr(pVar9);
        key->comment = pcVar7;
      }
      if (pub_only) {
        comment.len._0_4_ = 1;
      }
      else if (key == (RSAKey *)0x0) {
        comment.len._0_4_ = (uint)(uVar2 != '\0');
        *error = (char *)0x0;
      }
      else {
        if (uVar2 != '\0') {
          wanted = src->binarysource_->len - src->binarysource_->pos;
          if ((wanted & 7) != 0) goto LAB_00133467;
          pVar9 = BinarySource_get_data(src->binarysource_,wanted);
          _ret = strbuf_dup_nm(pVar9);
          pVar9 = ptrlen_from_asciz(passphrase);
          hash_simple(&ssh_md5,pVar9,local_98);
          des3_decrypt_pubkey(local_98,_ret->u,(int)wanted);
          smemclr(local_98,0x10);
          pVar9 = ptrlen_from_strbuf(_ret);
          BinarySource_INIT__(src,pVar9);
        }
        uVar2 = BinarySource_get_byte(src->binarysource_);
        uVar3 = BinarySource_get_byte(src->binarysource_);
        uVar4 = BinarySource_get_byte(src->binarysource_);
        uVar5 = BinarySource_get_byte(src->binarysource_);
        if ((uVar2 == uVar4) && (uVar3 == uVar5)) {
          BinarySource_get_rsa_ssh1_priv(src->binarysource_,key);
          pmVar8 = BinarySource_get_mp_ssh1(src->binarysource_);
          key->iqmp = pmVar8;
          pmVar8 = BinarySource_get_mp_ssh1(src->binarysource_);
          key->q = pmVar8;
          pmVar8 = BinarySource_get_mp_ssh1(src->binarysource_);
          key->p = pmVar8;
          comment.len._0_1_ = rsa_verify(key);
          if (comment.len._0_1_) {
            *error = (char *)0x0;
          }
          else {
            *error = "rsa_verify failed";
            freersakey(key);
          }
          comment.len._1_3_ = 0;
        }
        else {
          *error = "wrong passphrase";
          comment.len._0_4_ = 0xffffffff;
        }
      }
    }
  }
LAB_00133467:
  if (_ret != (strbuf *)0x0) {
    strbuf_free(_ret);
  }
  return (uint)comment.len;
}

Assistant:

static int rsa1_load_s_internal(BinarySource *src, RSAKey *key, bool pub_only,
                                char **commentptr, const char *passphrase,
                                const char **error)
{
    strbuf *buf = NULL;
    int ciphertype;
    int ret = 0;
    ptrlen comment;

    *error = "not an SSH-1 RSA file";

    if (!expect_signature(src, rsa1_signature))
        goto end;

    *error = "file format error";

    /* One byte giving encryption type, and one reserved uint32. */
    ciphertype = get_byte(src);
    if (ciphertype != 0 && ciphertype != SSH1_CIPHER_3DES)
        goto end;
    if (get_uint32(src) != 0)
        goto end;                 /* reserved field nonzero, panic! */

    /* Now the serious stuff. An ordinary SSH-1 public key. */
    get_rsa_ssh1_pub(src, key, RSA_SSH1_MODULUS_FIRST);

    /* Next, the comment field. */
    comment = get_string(src);
    if (commentptr)
        *commentptr = mkstr(comment);
    if (key)
        key->comment = mkstr(comment);

    if (pub_only) {
        ret = 1;
        goto end;
    }

    if (!key) {
        ret = ciphertype != 0;
        *error = NULL;
        goto end;
    }

    /*
     * Decrypt remainder of buffer.
     */
    if (ciphertype) {
        size_t enclen = get_avail(src);
        if (enclen & 7)
            goto end;

        buf = strbuf_dup_nm(get_data(src, enclen));

        unsigned char keybuf[16];
        hash_simple(&ssh_md5, ptrlen_from_asciz(passphrase), keybuf);
        des3_decrypt_pubkey(keybuf, buf->u, enclen);
        smemclr(keybuf, sizeof(keybuf));        /* burn the evidence */

        BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(buf));
    }

    /*
     * We are now in the secret part of the key. The first four
     * bytes should be of the form a, b, a, b.
     */
    {
        int b0a = get_byte(src);
        int b1a = get_byte(src);
        int b0b = get_byte(src);
        int b1b = get_byte(src);
        if (b0a != b0b || b1a != b1b) {
            *error = "wrong passphrase";
            ret = -1;
            goto end;
        }
    }

    /*
     * After that, we have one further bignum which is our
     * decryption exponent, and then the three auxiliary values
     * (iqmp, q, p).
     */
    get_rsa_ssh1_priv(src, key);
    key->iqmp = get_mp_ssh1(src);
    key->q = get_mp_ssh1(src);
    key->p = get_mp_ssh1(src);

    if (!rsa_verify(key)) {
        *error = "rsa_verify failed";
        freersakey(key);
        ret = 0;
    } else {
        *error = NULL;
        ret = 1;
    }

  end:
    if (buf)
        strbuf_free(buf);
    return ret;
}